

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpPropertiesAscii(Node *this,ostream *s,int indent)

{
  size_type sVar1;
  reference this_00;
  ulong local_28;
  size_t i;
  int indent_local;
  ostream *s_local;
  Node *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::
            vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
            ::size(&this->properties);
    if (sVar1 <= local_28) break;
    if (local_28 != 0) {
      std::operator<<(s,", ");
    }
    this_00 = std::
              vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
              ::operator[](&this->properties,local_28);
    FBX::FBXExportProperty::DumpAscii(this_00,s,indent);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void FBX::Node::DumpPropertiesAscii(std::ostream &s, int indent)
{
    for (size_t i = 0; i < properties.size(); ++i) {
        if (i > 0) { s << ", "; }
        properties[i].DumpAscii(s, indent);
    }
}